

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS ref_facelift_multiscale(REF_GRID ref_grid,REF_DBL target_complexity)

{
  REF_NODE ref_node;
  REF_FACELIFT ref_facelift;
  REF_CELL ref_cell;
  REF_GLOB *pRVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  REF_STATUS RVar5;
  REF_DBL *recon;
  REF_DBL *pRVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double complexity;
  REF_DBL RVar17;
  REF_DBL det;
  REF_DBL area;
  REF_DBL diag_system2 [6];
  REF_DBL n [3];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_DBL combined [6];
  REF_DBL diag_system [12];
  REF_DBL m [6];
  REF_INT nodes [27];
  REF_DBL *local_240;
  double local_228;
  double local_220;
  REF_DBL local_218;
  double local_200;
  REF_DBL local_1f8;
  undefined8 local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  REF_DBL local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  REF_DBL local_1a8 [4];
  REF_DBL local_188 [4];
  REF_DBL local_168;
  REF_DBL RStack_160;
  REF_DBL local_158;
  REF_DBL RStack_150;
  REF_DBL local_148;
  REF_DBL RStack_140;
  REF_DBL local_138;
  undefined8 local_130;
  double adStack_120 [6];
  REF_DBL local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  REF_DBL local_d8 [6];
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_facelift = ref_grid->geom->ref_facelift;
  local_218 = target_complexity;
  if (ref_facelift != (REF_FACELIFT)0x0) {
    ref_facelift_free(ref_facelift);
  }
  uVar3 = ref_facelift_attach(ref_grid);
  if (uVar3 == 0) {
    if (ref_node->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x591,"ref_facelift_multiscale","malloc metric of REF_DBL negative");
      return 1;
    }
    ref_cell = ref_grid->geom->ref_facelift->tri_cell;
    recon = (REF_DBL *)malloc((ulong)(uint)ref_node->max * 0x30);
    if (recon == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x591,"ref_facelift_multiscale","malloc metric of REF_DBL NULL");
      return 2;
    }
    uVar3 = ref_grid->node->max;
    uVar13 = (ulong)uVar3;
    if ((int)uVar3 < 0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x593,"ref_facelift_multiscale","malloc hess of REF_DBL negative");
      uVar3 = 1;
    }
    else {
      local_240 = (REF_DBL *)malloc(uVar13 * 0x18);
      if (local_240 == (REF_DBL *)0x0) {
        bVar2 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x593,"ref_facelift_multiscale","malloc hess of REF_DBL NULL");
        uVar3 = 2;
        local_240 = (REF_DBL *)0x0;
      }
      else {
        bVar2 = true;
        uVar3 = 0;
        if (uVar13 != 0) {
          uVar8 = 1;
          if (1 < (int)(uVar13 * 3)) {
            uVar8 = uVar13 * 3 & 0xffffffff;
          }
          memset(local_240,0,uVar8 << 3);
        }
      }
    }
    if (!bVar2) {
      return uVar3;
    }
    uVar4 = ref_recon_rsn_hess_face(ref_grid,local_240);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x594,"ref_facelift_multiscale",(ulong)uVar4,"rsn");
      return uVar4;
    }
    if (0 < ref_node->max) {
      lVar12 = 0;
      pRVar6 = local_240;
      do {
        if (-1 < ref_node->global[lVar12]) {
          uVar4 = ref_matrix_det_m2(local_240 + lVar12 * 3,&local_220);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x596,"ref_facelift_multiscale",(ulong)uVar4,"2x2 det");
            return uVar4;
          }
          if (0.0 < local_220) {
            lVar9 = 0;
            do {
              dVar14 = pow(local_220,-0.16666666666666666);
              pRVar6[lVar9] = dVar14 * pRVar6[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
          }
        }
        lVar12 = lVar12 + 1;
        pRVar6 = pRVar6 + 3;
      } while (lVar12 < ref_node->max);
    }
    if (ref_cell->max < 1) {
      local_228 = 0.0;
    }
    else {
      local_228 = 0.0;
      iVar11 = 0;
      do {
        RVar5 = ref_cell_nodes(ref_cell,iVar11,local_a8);
        if (RVar5 == 0) {
          uVar4 = ref_node_tri_area(ref_node,local_a8,&local_200);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x59e,"ref_facelift_multiscale",(ulong)uVar4,"area");
            return uVar4;
          }
          if (0 < ref_cell->node_per) {
            lVar12 = 0;
            do {
              if (ref_node->ref_mpi->id == ref_node->part[local_a8[lVar12]]) {
                uVar4 = ref_matrix_det_m2(local_240 + (long)local_a8[lVar12] * 3,&local_220);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x5a1,"ref_facelift_multiscale",(ulong)uVar4,"2x2 det");
                  return uVar4;
                }
                if (0.0 < local_220) {
                  if (local_220 < 0.0) {
                    dVar14 = sqrt(local_220);
                  }
                  else {
                    dVar14 = SQRT(local_220);
                  }
                  local_228 = local_228 + (dVar14 * local_200) / (double)ref_cell->node_per;
                }
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < ref_cell->node_per);
          }
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < ref_cell->max);
    }
    dVar14 = local_228 * 1e+20;
    if (dVar14 <= -dVar14) {
      dVar14 = -dVar14;
    }
    complexity = -local_218;
    RVar17 = local_218;
    if (local_218 <= complexity) {
      RVar17 = complexity;
    }
    if (RVar17 < dVar14) {
      iVar11 = ref_node->max;
      if (0 < (long)iVar11) {
        pRVar1 = ref_node->global;
        lVar12 = 0;
        pRVar6 = local_240;
        do {
          if (-1 < pRVar1[lVar12]) {
            lVar9 = 0;
            do {
              complexity = pRVar6[lVar9] * (local_218 / local_228);
              pRVar6[lVar9] = complexity;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
          }
          lVar12 = lVar12 + 1;
          pRVar6 = pRVar6 + 3;
        } while (lVar12 != iVar11);
      }
      if (0 < ref_node->max) {
        lVar12 = 0;
        do {
          if (-1 < ref_node->global[lVar12]) {
            uVar4 = ref_recon_rsn(ref_grid,(REF_INT)lVar12,local_188,local_1a8,&local_1c8);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x5b6,"ref_facelift_multiscale",(ulong)uVar4,"rsn");
              return uVar4;
            }
            uVar4 = ref_matrix_diag_m2(local_240 + lVar12 * 3,&local_1f8);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x5b7,"ref_facelift_multiscale",(ulong)uVar4,"decomp");
              return uVar4;
            }
            local_138 = local_1f8;
            lVar9 = 0;
            do {
              adStack_120[lVar9] = local_188[lVar9] * local_1e8 + local_1a8[lVar9] * local_1e0;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            uVar15 = (undefined4)local_1f0;
            uVar16 = (undefined4)((ulong)local_1f0 >> 0x20);
            local_130 = local_1f0;
            lVar9 = 0;
            do {
              adStack_120[lVar9 + 3] = local_188[lVar9] * local_1d8 + local_1a8[lVar9] * local_1d0;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_e0 = local_1b8;
            local_f0 = local_1c8;
            uStack_e8 = uStack_1c0;
            uVar4 = ref_matrix_form_m(&local_138,recon + lVar12 * 6);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x5c8,"ref_facelift_multiscale",(ulong)uVar4,"form m");
              uVar3 = uVar4;
            }
            complexity = (double)CONCAT44(uVar16,uVar15);
            if (uVar4 != 0) {
              return uVar3;
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < ref_node->max);
      }
      if (local_240 != (REF_DBL *)0x0) {
        free(local_240);
      }
      uVar3 = ref_recon_roundoff_limit(recon,ref_grid);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x5d3,"ref_facelift_multiscale",(ulong)uVar3,"floor eigs above zero");
        return uVar3;
      }
      uVar3 = ref_facelift_gradation_at_complexity(recon,ref_grid,local_218,complexity);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x5e0,"ref_facelift_multiscale",(ulong)uVar3,"gradation at complexity");
        return uVar3;
      }
      if (0 < ref_node->max) {
        uVar13 = 0;
        lVar12 = 0;
        do {
          if (-1 < ref_node->global[lVar12]) {
            uVar3 = ref_node_metric_get(ref_node,(REF_INT)lVar12,local_d8);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x5e3,"ref_facelift_multiscale",(ulong)uVar3,"curve metric");
              return uVar3;
            }
            uVar3 = ref_matrix_intersect((REF_DBL *)((long)recon + uVar13),local_d8,&local_168);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x5e4,"ref_facelift_multiscale",(ulong)uVar3,"intersect");
              return uVar3;
            }
            pRVar6 = (REF_DBL *)((uVar13 & 0x7fffffff0) + (long)recon);
            pRVar6[4] = local_148;
            pRVar6[5] = RStack_140;
            pRVar6[2] = local_158;
            pRVar6[3] = RStack_150;
            *pRVar6 = local_168;
            pRVar6[1] = RStack_160;
          }
          lVar12 = lVar12 + 1;
          uVar13 = uVar13 + 0x30;
        } while (lVar12 < ref_node->max);
      }
      uVar3 = ref_metric_to_node(recon,ref_grid->node);
      if (uVar3 == 0) {
        free(recon);
        return 0;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x5ed,"ref_facelift_multiscale",(ulong)uVar3,"to");
      return uVar3;
    }
    pcVar10 = "zero compelxity";
    uVar3 = 4;
    uVar7 = 0x5ab;
    uVar13 = 4;
  }
  else {
    pcVar10 = "attach";
    uVar7 = 0x58b;
    uVar13 = (ulong)uVar3;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar7,
         "ref_facelift_multiscale",uVar13,pcVar10);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_multiscale(REF_GRID ref_grid,
                                           REF_DBL target_complexity) {
  REF_FACELIFT ref_facelift;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL *hess, *metric;
  REF_INT node, i;
  REF_INT dimension = 2, p_norm = 2;
  REF_INT gradation = -1.0;
  REF_DBL det, exponent, complexity, area, complexity_scale;
  REF_DBL diag_system2[6];
  REF_DBL diag_system[12];
  REF_DBL m[6], combined[6];
  REF_DBL r[3], s[3], n[3];
  REF_BOOL verbose = REF_FALSE;
  REF_BOOL steps = REF_FALSE;
  REF_INT cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];

  /* reset facelift to match grid */
  ref_facelift = ref_geom_facelift(ref_grid_geom(ref_grid));
  if (NULL != ref_facelift) ref_facelift_free(ref_facelift);
  ref_facelift = NULL;
  RSS(ref_facelift_attach(ref_grid), "attach");
  ref_facelift = ref_geom_facelift(ref_grid_geom(ref_grid));
  ref_cell = ref_facelift_tri(ref_facelift);

  exponent = -1.0 / ((REF_DBL)(2 * p_norm + dimension));

  ref_malloc(metric, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc_init(hess, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL,
                  0.0);
  RSS(ref_recon_rsn_hess_face(ref_grid, hess), "rsn");
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_det_m2(&(hess[3 * node]), &det), "2x2 det");
    if (det > 0.0) { /* local scaling */
      for (i = 0; i < 3; i++) hess[i + 3 * node] *= pow(det, exponent);
    }
  }

  complexity = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        RSS(ref_matrix_det_m2(&(hess[3 * nodes[cell_node]]), &det), "2x2 det");
        if (det > 0.0) {
          complexity +=
              sqrt(det) * area / ((REF_DBL)ref_cell_node_per(ref_cell));
        }
      }
    }
  }

  if (!ref_math_divisible(target_complexity, complexity)) {
    RSS(REF_DIV_ZERO, "zero compelxity");
  }

  complexity_scale = 1.0;
  each_ref_node_valid_node(ref_node, node) { /* global scaling */
    for (i = 0; i < 3; i++)
      hess[i + 3 * node] *=
          pow(target_complexity / complexity, complexity_scale);
  }

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_recon_rsn(ref_grid, node, r, s, n), "rsn");
    RSS(ref_matrix_diag_m2(&(hess[3 * node]), diag_system2), "decomp");
    ref_matrix_eig(diag_system, 0) = ref_matrix_eig2(diag_system2, 0);
    for (i = 0; i < 3; i++) {
      ref_matrix_vec(diag_system, i, 0) =
          ref_matrix_vec2(diag_system2, 0, 0) * r[i] +
          ref_matrix_vec2(diag_system2, 1, 0) * s[i];
    }
    ref_matrix_eig(diag_system, 1) = ref_matrix_eig2(diag_system2, 1);
    for (i = 0; i < 3; i++) {
      ref_matrix_vec(diag_system, i, 1) =
          ref_matrix_vec2(diag_system2, 0, 1) * r[i] +
          ref_matrix_vec2(diag_system2, 1, 1) * s[i];
    }
    ref_matrix_eig(diag_system, 2) =
        MAX(ref_matrix_eig2(diag_system2, 0), ref_matrix_eig2(diag_system2, 1));
    for (i = 0; i < 3; i++) ref_matrix_vec(diag_system, i, 2) = n[i];

    RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "form m");
    if (verbose) {
      ref_matrix_show_diag_sys(diag_system);
      ref_metric_show(&(metric[6 * node]));
      printf("n %f %f %f\n", n[0], n[1], n[2]);
      printf("v %f %f %f\n", diag_system[0 + 9], diag_system[1 + 9],
             diag_system[2 + 9]);
    }
  }
  ref_free(hess);

  RSS(ref_recon_roundoff_limit(metric, ref_grid), "floor eigs above zero");

  if (steps) {
    RSS(ref_metric_to_node(metric,
                           ref_grid_node(ref_facelift_grid(ref_facelift))),
        "to");
    RSS(ref_export_tec_metric_ellipse(ref_facelift_grid(ref_facelift),
                                      "ref_facelift_raw"),
        "al");
  }

  RSS(ref_facelift_gradation_at_complexity(metric, ref_grid, gradation,
                                           target_complexity),
      "gradation at complexity");

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "curve metric");
    RSS(ref_matrix_intersect(&(metric[6 * node]), m, combined), "intersect");
    if (verbose) {
      ref_metric_show(&(metric[6 * node]));
      ref_metric_show(m);
      ref_metric_show(combined);
      printf("\n");
    }
    for (i = 0; i < 6; i++) metric[i + 6 * node] = combined[i];
  }
  RSS(ref_metric_to_node(metric, ref_grid_node(ref_grid)), "to");

  if (steps) {
    RSS(ref_metric_to_node(metric,
                           ref_grid_node(ref_facelift_grid(ref_facelift))),
        "to");
    RSS(ref_export_tec_metric_ellipse(ref_facelift_grid(ref_facelift),
                                      "ref_facelift_grad"),
        "al");
  }

  ref_free(metric);

  return REF_SUCCESS;
}